

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

int __thiscall
QHttpNetworkConnectionPrivate::indexOf(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  ulong uVar1;
  ulong uVar2;
  QIODevice **ppQVar3;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  uVar2 = (ulong)(uint)this->activeChannelCount;
  if (this->activeChannelCount < 1) {
    uVar2 = uVar1;
  }
  ppQVar3 = &this->channels->socket;
  do {
    if (uVar2 == uVar1) {
      local_28[0] = '\x02';
      local_28[1] = '\0';
      local_28[2] = '\0';
      local_28[3] = '\0';
      local_28[0x14] = '\0';
      local_28[0x15] = '\0';
      local_28[0x16] = '\0';
      local_28[0x17] = '\0';
      local_28[4] = '\0';
      local_28[5] = '\0';
      local_28[6] = '\0';
      local_28[7] = '\0';
      local_28[8] = '\0';
      local_28[9] = '\0';
      local_28[10] = '\0';
      local_28[0xb] = '\0';
      local_28[0xc] = '\0';
      local_28[0xd] = '\0';
      local_28[0xe] = '\0';
      local_28[0xf] = '\0';
      local_28[0x10] = '\0';
      local_28[0x11] = '\0';
      local_28[0x12] = '\0';
      local_28[0x13] = '\0';
      local_10 = "default";
      QMessageLogger::fatal(local_28,"Called with unknown socket object.");
LAB_001e99ca:
      __stack_chk_fail();
    }
    if (*ppQVar3 == socket) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (int)uVar1;
      }
      goto LAB_001e99ca;
    }
    uVar1 = uVar1 + 1;
    ppQVar3 = ppQVar3 + 0x21;
  } while( true );
}

Assistant:

int QHttpNetworkConnectionPrivate::indexOf(QIODevice *socket) const
{
    for (int i = 0; i < activeChannelCount; ++i)
        if (channels[i].socket == socket)
            return i;

    qFatal("Called with unknown socket object.");
    return 0;
}